

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

Slice __thiscall leveldb::MemTableIterator::key(MemTableIterator *this)

{
  long lVar1;
  char **ppcVar2;
  long in_FS_OFFSET;
  Slice SVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppcVar2 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::key(&this->iter_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar3 = GetLengthPrefixedSlice(*ppcVar2);
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

Slice key() const override { return GetLengthPrefixedSlice(iter_.key()); }